

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int read_StreamsInfo(archive_read *a,_7z_stream_info *si)

{
  _7z_coders_info *val;
  byte bVar1;
  void *pvVar2;
  _7z_folder *p_Var3;
  int iVar4;
  uchar *puVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  _7z_folder *p_Var8;
  _7z_coder *p_Var9;
  byte *pbVar10;
  uchar *__dest;
  anon_struct_16_2_4d417c8e *paVar11;
  uint64_t *puVar12;
  uint32_t *puVar13;
  ulong uVar14;
  uint64_t uVar15;
  uint uVar16;
  uint uVar17;
  unsigned_long id;
  uint i;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  uchar uVar22;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  ulong local_68;
  _7z_digests local_58;
  uint64_t local_48;
  ulong local_40;
  void *local_38;
  
  pvVar2 = a->format->data;
  (si->ss).unpackSizes = (uint64_t *)0x0;
  (si->ss).digestsDefined = (uchar *)0x0;
  (si->ci).dataStreamIndex = 0;
  (si->ss).unpack_streams = 0;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->pi).digest.digests = (uint32_t *)0x0;
  (si->pi).positions = (uint64_t *)0x0;
  (si->pi).sizes = (uint64_t *)0x0;
  (si->pi).digest.defineds = (uchar *)0x0;
  (si->pi).pos = 0;
  (si->pi).numPackStreams = 0;
  (si->ss).digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if (puVar5 == (uchar *)0x0) {
    return -1;
  }
  uVar22 = *puVar5;
  if (uVar22 == '\x06') {
    (si->pi).digest.digests = (uint32_t *)0x0;
    (si->pi).positions = (uint64_t *)0x0;
    (si->pi).sizes = (uint64_t *)0x0;
    (si->pi).digest.defineds = (uchar *)0x0;
    (si->pi).pos = 0;
    (si->pi).numPackStreams = 0;
    iVar4 = parse_7zip_uint64(a,(uint64_t *)si);
    if (iVar4 < 0) {
      return -1;
    }
    puVar12 = &(si->pi).numPackStreams;
    iVar4 = parse_7zip_uint64(a,puVar12);
    if (iVar4 < 0) {
      return -1;
    }
    if (*puVar12 - 0x5f5e101 < 0xfffffffffa0a1f00) {
      return -1;
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar5 != '\0') {
      if (*puVar5 != '\t') {
        return -1;
      }
      sVar20 = (si->pi).numPackStreams;
      puVar6 = (uint64_t *)calloc(sVar20,8);
      (si->pi).sizes = puVar6;
      puVar7 = (uint64_t *)calloc(sVar20,8);
      (si->pi).positions = puVar7;
      if (puVar7 == (uint64_t *)0x0 || puVar6 == (uint64_t *)0x0) {
        return -1;
      }
      uVar16 = 0;
      while ((ulong)uVar16 < *puVar12) {
        iVar4 = parse_7zip_uint64(a,(si->pi).sizes + uVar16);
        uVar16 = uVar16 + 1;
        if (iVar4 < 0) {
          return -1;
        }
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      if (*puVar5 == '\0') {
        sVar20 = (si->pi).numPackStreams;
        puVar5 = (uchar *)calloc(sVar20,1);
        (si->pi).digest.defineds = puVar5;
        puVar13 = (uint32_t *)calloc(sVar20,4);
        (si->pi).digest.digests = puVar13;
        if (puVar13 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        if (*puVar5 != '\n') {
          return -1;
        }
        iVar4 = read_Digests(a,&(si->pi).digest,(si->pi).numPackStreams);
        if (iVar4 < 0) {
          return -1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        if (*puVar5 != '\0') {
          return -1;
        }
      }
    }
    puVar6 = (si->pi).positions;
    if (puVar6 == (uint64_t *)0x0) {
      return -1;
    }
    puVar7 = (si->pi).sizes;
    if (puVar7 == (uint64_t *)0x0) {
      return -1;
    }
    uVar18 = (si->pi).pos;
    uVar16 = 0;
    while (uVar21 = (ulong)uVar16, uVar21 < *puVar12) {
      puVar6[uVar21] = uVar18;
      uVar18 = uVar18 + puVar7[uVar21];
      uVar16 = uVar16 + 1;
      if (*(ulong *)((long)pvVar2 + 0x80) < uVar18) {
        return -1;
      }
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 == (uchar *)0x0) {
      return -1;
    }
    uVar22 = *puVar5;
  }
  if (uVar22 != '\a') goto LAB_00582e57;
  (si->ci).numFolders = 0;
  (si->ci).folders = (_7z_folder *)0x0;
  (si->ci).dataStreamIndex = 0;
  local_58.defineds = (uchar *)0x0;
  local_58.digests = (uint32_t *)0x0;
  puVar5 = header_bytes(a,1);
  if ((puVar5 == (uchar *)0x0) || (*puVar5 != '\v')) goto LAB_00582ccd;
  val = &si->ci;
  iVar4 = parse_7zip_uint64(a,&val->numFolders);
  if (iVar4 < 0) goto LAB_00582ccd;
  if (100000000 < val->numFolders) {
    return -1;
  }
  puVar5 = header_bytes(a,1);
  if (puVar5 == (uchar *)0x0) goto LAB_00582ccd;
  if (*puVar5 == '\x01') {
    puVar12 = &(si->ci).dataStreamIndex;
    iVar4 = parse_7zip_uint64(a,puVar12);
    if (iVar4 < 0) {
      return -1;
    }
    if (100000000 < *puVar12) {
      return -1;
    }
    if (val->numFolders != 0) goto LAB_00582cb7;
  }
  else {
    if (*puVar5 != '\0') {
LAB_00582cb7:
      archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
      goto LAB_00582ccd;
    }
    sVar20 = (si->ci).numFolders;
    p_Var8 = (_7z_folder *)calloc(sVar20,0x68);
    (si->ci).folders = p_Var8;
    if (p_Var8 == (_7z_folder *)0x0) {
      return -1;
    }
    uVar16 = 0;
    while (uVar18 = (ulong)uVar16, uVar18 < sVar20) {
      p_Var3 = (si->ci).folders;
      p_Var8 = p_Var3 + uVar18;
      local_38 = a->format->data;
      p_Var3[uVar18].numUnpackStreams = 0;
      (&p_Var3[uVar18].numUnpackStreams)[1] = 0;
      p_Var3[uVar18].unPackSize = (uint64_t *)0x0;
      (&p_Var3[uVar18].unPackSize)[1] = (uint64_t *)0x0;
      p_Var3[uVar18].numInStreams = 0;
      (&p_Var3[uVar18].numInStreams)[1] = 0;
      p_Var3[uVar18].numPackedStreams = 0;
      (&p_Var3[uVar18].numPackedStreams)[1] = 0;
      p_Var3[uVar18].numBindPairs = 0;
      (&p_Var3[uVar18].numBindPairs)[1] = 0;
      p_Var3[uVar18].numCoders = 0;
      p_Var3[uVar18].coders = (_7z_coder *)0x0;
      p_Var3[uVar18].skipped_bytes = 0;
      local_40 = uVar18;
      iVar4 = parse_7zip_uint64(a,&p_Var8->numCoders);
      if ((iVar4 < 0) || (uVar18 = p_Var8->numCoders, 4 < uVar18)) goto LAB_00582ccd;
      p_Var9 = (_7z_coder *)calloc(uVar18,0x28);
      p_Var8->coders = p_Var9;
      if (p_Var9 == (_7z_coder *)0x0) goto LAB_00582ccd;
      local_48 = 0;
      local_68 = 0;
      for (uVar16 = 0; uVar21 = (ulong)uVar16, uVar21 < uVar18; uVar16 = uVar16 + 1) {
        pbVar10 = header_bytes(a,1);
        if ((pbVar10 == (byte *)0x0) || (bVar1 = *pbVar10, (char)bVar1 < '\0')) goto LAB_00582ccd;
        puVar5 = header_bytes(a,(ulong)(bVar1 & 0xf));
        if (puVar5 == (uchar *)0x0) goto LAB_00582ccd;
        uVar18 = 0;
        for (uVar19 = 0; (bVar1 & 0xf) != uVar19; uVar19 = uVar19 + 1) {
          uVar18 = uVar18 << 8 | (ulong)puVar5[uVar19];
        }
        p_Var9 = p_Var8->coders;
        puVar12 = &p_Var9[uVar21].numInStreams;
        p_Var9[uVar21].codec = uVar18;
        if ((bVar1 & 0x10) == 0) {
          *puVar12 = 1;
          p_Var9[uVar21].numOutStreams = 1;
        }
        else {
          iVar4 = parse_7zip_uint64(a,puVar12);
          if ((((iVar4 < 0) || (100000000 < p_Var8->coders[uVar21].numInStreams)) ||
              (iVar4 = parse_7zip_uint64(a,&p_Var8->coders[uVar21].numOutStreams), iVar4 < 0)) ||
             (p_Var9 = p_Var8->coders, 100000000 < p_Var9[uVar21].numOutStreams)) goto LAB_00582ccd;
        }
        if ((bVar1 & 0x20) != 0) {
          iVar4 = parse_7zip_uint64(a,&p_Var9[uVar21].propertiesSize);
          if ((iVar4 < 0) ||
             (puVar5 = header_bytes(a,p_Var8->coders[uVar21].propertiesSize), puVar5 == (uchar *)0x0
             )) goto LAB_00582ccd;
          p_Var9 = p_Var8->coders;
          sVar20 = p_Var9[uVar21].propertiesSize;
          __dest = (uchar *)malloc(sVar20);
          p_Var9[uVar21].properties = __dest;
          if (__dest == (uchar *)0x0) goto LAB_00582ccd;
          memcpy(__dest,puVar5,sVar20);
        }
        local_68 = local_68 + p_Var9[uVar21].numInStreams;
        local_48 = local_48 + p_Var9[uVar21].numOutStreams;
        uVar18 = p_Var8->numCoders;
      }
      if (((local_48 == 0) || (sVar20 = local_48 - 1, local_68 < sVar20)) ||
         (p_Var8->numBindPairs = sVar20, *(ulong *)((long)local_38 + 0x70) < sVar20))
      goto LAB_00582ccd;
      if (sVar20 == 0) {
        p_Var8->bindPairs = (anon_struct_16_2_4d417c8e *)0x0;
        paVar11 = (anon_struct_16_2_4d417c8e *)0x0;
      }
      else {
        paVar11 = (anon_struct_16_2_4d417c8e *)calloc(sVar20,0x10);
        p_Var8->bindPairs = paVar11;
        if (paVar11 == (anon_struct_16_2_4d417c8e *)0x0) goto LAB_00582ccd;
      }
      uVar16 = 0;
      while( true ) {
        uVar21 = (ulong)uVar16;
        uVar18 = p_Var8->numBindPairs;
        if (uVar18 <= uVar21) break;
        iVar4 = parse_7zip_uint64(a,&paVar11[uVar21].inIndex);
        if (((iVar4 < 0) || (100000000 < p_Var8->bindPairs[uVar21].inIndex)) ||
           (iVar4 = parse_7zip_uint64(a,&p_Var8->bindPairs[uVar21].outIndex), iVar4 < 0))
        goto LAB_00582ccd;
        paVar11 = p_Var8->bindPairs;
        uVar16 = uVar16 + 1;
        if (100000000 < paVar11[uVar21].outIndex) goto LAB_00582ccd;
      }
      sVar20 = local_68 - uVar18;
      p_Var8->numPackedStreams = sVar20;
      puVar12 = (uint64_t *)calloc(sVar20,8);
      p_Var8->packedStreams = puVar12;
      if (puVar12 == (uint64_t *)0x0) goto LAB_00582ccd;
      if (sVar20 == 1) {
        uVar21 = 0;
        do {
          uVar19 = uVar21;
          if (local_68 <= uVar19) break;
          uVar21 = 0;
          do {
            uVar14 = uVar21;
            if (uVar18 <= uVar14) break;
            uVar21 = (ulong)((int)uVar14 + 1);
          } while (paVar11[uVar14].inIndex != uVar19);
          uVar21 = (ulong)((int)uVar19 + 1);
        } while (uVar18 != uVar14);
        if (local_68 == uVar19) goto LAB_00582ccd;
        *puVar12 = uVar19;
      }
      else {
        uVar16 = 0;
        while (uVar18 = (ulong)uVar16, uVar18 < p_Var8->numPackedStreams) {
          iVar4 = parse_7zip_uint64(a,puVar12 + uVar18);
          if (iVar4 < 0) goto LAB_00582ccd;
          puVar12 = p_Var8->packedStreams;
          uVar16 = uVar16 + 1;
          if (100000000 < puVar12[uVar18]) goto LAB_00582ccd;
        }
      }
      p_Var8->numInStreams = local_68;
      p_Var8->numOutStreams = local_48;
      sVar20 = val->numFolders;
      uVar16 = (int)local_40 + 1;
    }
  }
  puVar5 = header_bytes(a,1);
  if ((puVar5 != (uchar *)0x0) && (*puVar5 == '\f')) {
    for (uVar16 = 0; uVar18 = (ulong)uVar16, uVar18 < val->numFolders; uVar16 = uVar16 + 1) {
      p_Var8 = (si->ci).folders;
      puVar12 = (uint64_t *)calloc(p_Var8[uVar18].numOutStreams,8);
      p_Var8[uVar18].unPackSize = puVar12;
      if (puVar12 == (uint64_t *)0x0) goto LAB_00582ccd;
      uVar21 = 0;
      while (uVar21 < p_Var8[uVar18].numOutStreams) {
        iVar4 = parse_7zip_uint64(a,p_Var8[uVar18].unPackSize + uVar21);
        uVar21 = (ulong)((int)uVar21 + 1);
        if (iVar4 < 0) goto LAB_00582ccd;
      }
    }
    puVar5 = header_bytes(a,1);
    if (puVar5 != (uchar *)0x0) {
      if (*puVar5 == '\n') {
        iVar4 = read_Digests(a,&local_58,val->numFolders);
        if (iVar4 < 0) goto LAB_00582ccd;
        uVar18 = val->numFolders;
        for (uVar16 = 0; uVar21 = (ulong)uVar16, uVar21 < uVar18; uVar16 = uVar16 + 1) {
          p_Var8 = (si->ci).folders;
          p_Var8[uVar21].digest_defined = local_58.defineds[uVar21];
          p_Var8[uVar21].digest = local_58.digests[uVar21];
        }
        puVar5 = header_bytes(a,1);
        if ((puVar5 == (uchar *)0x0) || (*puVar5 != '\0')) goto LAB_00582ccd;
        free_Digest(&local_58);
      }
      else if (*puVar5 != '\0') goto LAB_00582ccd;
      uVar18 = (si->ci).numFolders;
      p_Var8 = (si->ci).folders;
      uVar16 = 0;
      uVar21 = 0;
      while (uVar19 = (ulong)uVar16, uVar19 < uVar18) {
        p_Var8[uVar19].packIndex = (uint32_t)uVar21;
        uVar21 = (ulong)((uint32_t)uVar21 + (int)p_Var8[uVar19].numPackedStreams);
        uVar16 = uVar16 + 1;
        if ((si->pi).numPackStreams < uVar21) {
          return -1;
        }
      }
      puVar5 = header_bytes(a,1);
      if (puVar5 == (uchar *)0x0) {
        return -1;
      }
      uVar22 = *puVar5;
LAB_00582e57:
      if (uVar22 == '\b') {
        uVar18 = (si->ci).numFolders;
        p_Var8 = (si->ci).folders;
        (si->ss).unpack_streams = 0;
        (si->ss).unpackSizes = (uint64_t *)0x0;
        (si->ss).digestsDefined = (uchar *)0x0;
        (si->ss).digests = (uint32_t *)0x0;
        for (uVar16 = 0; uVar16 < uVar18; uVar16 = uVar16 + 1) {
          p_Var8[uVar16].numUnpackStreams = 1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar22 = *puVar5;
        uVar21 = uVar18;
        if (uVar22 == '\r') {
          puVar12 = &p_Var8->numUnpackStreams;
          uVar21 = 0;
          uVar19 = uVar18;
          while (bVar25 = uVar19 != 0, uVar19 = uVar19 - 1, bVar25) {
            iVar4 = parse_7zip_uint64(a,puVar12);
            if (iVar4 < 0) {
              return -1;
            }
            if (100000000 < *puVar12) {
              return -1;
            }
            if (0xfffffffffa0a1eff < uVar21) {
              return -1;
            }
            uVar21 = uVar21 + *puVar12;
            puVar12 = puVar12 + 0xd;
          }
          puVar5 = header_bytes(a,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar22 = *puVar5;
        }
        (si->ss).unpack_streams = uVar21;
        if (uVar21 == 0) {
          puVar12 = (si->ss).unpackSizes;
        }
        else {
          puVar12 = (uint64_t *)calloc(uVar21,8);
          (si->ss).unpackSizes = puVar12;
          puVar5 = (uchar *)calloc(uVar21,1);
          (si->ss).digestsDefined = puVar5;
          puVar13 = (uint32_t *)calloc(uVar21,4);
          (si->ss).digests = puVar13;
          if (puVar12 == (uint64_t *)0x0) {
            return -1;
          }
          if (puVar13 == (uint32_t *)0x0 || puVar5 == (uchar *)0x0) {
            return -1;
          }
        }
        for (uVar16 = 0; uVar19 = (ulong)uVar16, uVar19 < uVar18; uVar16 = uVar16 + 1) {
          uVar14 = p_Var8[uVar19].numUnpackStreams;
          if (uVar14 != 0) {
            if (uVar22 == '\t') {
              lVar24 = 0;
              for (uVar23 = 1; uVar23 < uVar14; uVar23 = (ulong)((int)uVar23 + 1)) {
                iVar4 = parse_7zip_uint64(a,puVar12);
                if (iVar4 < 0) {
                  return -1;
                }
                lVar24 = lVar24 + *puVar12;
                puVar12 = puVar12 + 1;
                uVar14 = p_Var8[uVar19].numUnpackStreams;
              }
            }
            else {
              lVar24 = 0;
            }
            uVar15 = folder_uncompressed_size(p_Var8 + uVar19);
            *puVar12 = uVar15 - lVar24;
            puVar12 = puVar12 + 1;
          }
        }
        if (uVar22 == '\t') {
          puVar5 = header_bytes(a,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar22 = *puVar5;
        }
        for (uVar16 = 0; uVar19 = (ulong)uVar16, uVar19 < uVar21; uVar16 = uVar16 + 1) {
          (si->ss).digestsDefined[uVar19] = '\0';
          (si->ss).digests[uVar19] = 0;
        }
        uVar16 = 0;
        for (uVar17 = 0; uVar21 = (ulong)uVar17, uVar21 < uVar18; uVar17 = uVar17 + 1) {
          if ((p_Var8[uVar21].numUnpackStreams != 1) || (p_Var8[uVar21].digest_defined == '\0')) {
            uVar16 = uVar16 + (int)p_Var8[uVar21].numUnpackStreams;
          }
        }
        if (uVar22 == '\n') {
          puVar5 = (si->ss).digestsDefined;
          puVar13 = (si->ss).digests;
          local_58.defineds = (uchar *)0x0;
          local_58.digests = (uint32_t *)0x0;
          iVar4 = read_Digests(a,&local_58,(ulong)uVar16);
          if (iVar4 < 0) {
            free_Digest(&local_58);
            return -1;
          }
          iVar4 = 0;
          for (uVar21 = 0; uVar21 != uVar18; uVar21 = uVar21 + 1) {
            uVar15 = p_Var8[uVar21].numUnpackStreams;
            if ((uVar15 == 1) && (p_Var8[uVar21].digest_defined != '\0')) {
              *puVar5 = '\x01';
              puVar5 = puVar5 + 1;
              *puVar13 = p_Var8[uVar21].digest;
              puVar13 = puVar13 + 1;
            }
            else {
              lVar24 = (long)iVar4;
              for (uVar16 = 0; uVar16 < uVar15; uVar16 = uVar16 + 1) {
                *puVar5 = local_58.defineds[lVar24];
                puVar5 = puVar5 + 1;
                *puVar13 = local_58.digests[lVar24];
                puVar13 = puVar13 + 1;
                lVar24 = lVar24 + 1;
                uVar15 = p_Var8[uVar21].numUnpackStreams;
              }
              iVar4 = iVar4 + uVar16;
            }
          }
          free_Digest(&local_58);
          puVar5 = header_bytes(a,1);
          if (puVar5 == (uchar *)0x0) {
            return -1;
          }
          uVar22 = *puVar5;
        }
        if (uVar22 != '\0') {
          return -1;
        }
        puVar5 = header_bytes(a,1);
        if (puVar5 == (uchar *)0x0) {
          return -1;
        }
        uVar22 = *puVar5;
      }
      return -(uint)(uVar22 != '\0');
    }
  }
LAB_00582ccd:
  free_Digest(&local_58);
  return -1;
}

Assistant:

static int
read_StreamsInfo(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	unsigned i;

	memset(si, 0, sizeof(*si));

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kPackInfo) {
		uint64_t packPos;

		if (read_PackInfo(a, &(si->pi)) < 0)
			return (-1);

		if (si->pi.positions == NULL || si->pi.sizes == NULL)
			return (-1);
		/*
		 * Calculate packed stream positions.
		 */
		packPos = si->pi.pos;
		for (i = 0; i < si->pi.numPackStreams; i++) {
			si->pi.positions[i] = packPos;
			packPos += si->pi.sizes[i];
			if (packPos > zip->header_offset)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kUnPackInfo) {
		uint32_t packIndex;
		struct _7z_folder *f;

		if (read_CodersInfo(a, &(si->ci)) < 0)
			return (-1);

		/*
		 * Calculate packed stream indexes.
		 */
		packIndex = 0;
		f = si->ci.folders;
		for (i = 0; i < si->ci.numFolders; i++) {
			f[i].packIndex = packIndex;
			packIndex += (uint32_t)f[i].numPackedStreams;
			if (packIndex > si->pi.numPackStreams)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	if (*p == kSubStreamsInfo) {
		if (read_SubStreamsInfo(a, &(si->ss),
		    si->ci.folders, (size_t)si->ci.numFolders) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 *  Must be kEnd.
	 */
	if (*p != kEnd)
		return (-1);
	return (0);
}